

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::PromisedAsyncIoStream::tryRead
          (PromisedAsyncIoStream *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  void *pvVar4;
  PromiseArena *in_R8;
  undefined1 local_68 [40];
  Event **local_40;
  undefined8 local_38;
  
  plVar1 = *(long **)((long)buffer + 0x30);
  if (plVar1 == (long *)0x0) {
    local_68._16_8_ = in_R8;
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_68);
    uVar3 = local_68._0_8_;
    pPVar2 = ((PromiseArenaMember *)local_68._0_8_)->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_68._0_8_ - (long)pPVar2) < 0x40) {
      pvVar4 = operator_new(0x400);
      local_68._8_8_ = (long)pvVar4 + 0x3c0;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_68._8_8_,(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2383:39)>
                 ::anon_class_32_4_a4bd11c1_for_func::operator());
      *(undefined ***)((long)pvVar4 + 0x3c0) = &PTR_destroy_006e09e8;
      *(void **)((long)pvVar4 + 0x3e0) = buffer;
      *(size_t *)((long)pvVar4 + 1000) = minBytes;
      *(size_t *)((long)pvVar4 + 0x3f0) = maxBytes;
      *(undefined8 *)((long)pvVar4 + 0x3f8) = local_68._16_8_;
      *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
    }
    else {
      ((PromiseArenaMember *)local_68._0_8_)->arena = (PromiseArena *)0x0;
      local_68._8_8_ = local_68._0_8_ + -0x40;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_68._8_8_,(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2383:39)>
                 ::anon_class_32_4_a4bd11c1_for_func::operator());
      ((PromiseArenaMember *)(uVar3 + -0x40))->_vptr_PromiseArenaMember =
           (_func_int **)&PTR_destroy_006e09e8;
      ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)buffer;
      ((PromiseArenaMember *)(uVar3 + -0x20))->arena = (PromiseArena *)minBytes;
      ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)maxBytes;
      ((PromiseArenaMember *)(uVar3 + -0x10))->arena = (PromiseArena *)local_68._16_8_;
      ((PromiseArenaMember *)(uVar3 + -0x40))->arena = pPVar2;
    }
    local_68._24_8_ = local_68._8_8_;
    local_68._32_8_ = &DAT_004ddfe0;
    local_40 = (Event **)&DAT_004de03f;
    local_38._0_1_ = true;
    local_38._1_3_ = 5;
    local_38._4_4_ = 0x4c;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)this,(OwnPromiseNode *)(local_68 + 0x18),
               (SourceLocation *)(local_68 + 0x20));
    uVar3 = local_68._24_8_;
    if ((EventLoop *)local_68._24_8_ != (EventLoop *)0x0) {
      local_68._24_8_ = (EventLoop *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
    uVar3 = local_68._0_8_;
    if ((PromiseArenaMember *)local_68._0_8_ != (PromiseArenaMember *)0x0) {
      local_68._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
    }
  }
  else {
    (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->tryRead(buffer, minBytes, maxBytes);
    }